

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTCallFunctionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ThreadContext *pTVar1;
  Var *ppvVar2;
  ExecutionInfoManager *this;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  ScriptContext *scriptContext;
  JsRTCallFunctionAction *pJVar7;
  Var pvVar8;
  RecyclableObject *pRVar9;
  undefined4 *puVar10;
  Type TVar11;
  uint32 i;
  ulong uVar12;
  Arguments local_b0;
  Arguments local_a0;
  TTDebuggerSourceLocation lastLocation;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar7 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  pTVar1 = scriptContext->threadContext;
  pvVar8 = InflateVarInReplay(executeContext,*pJVar7->ArgArray);
  if ((pvVar8 != (Var)0x0) && (bVar4 = Js::VarIs<Js::JavascriptFunction>(pvVar8), bVar4)) {
    pRVar9 = Js::VarTo<Js::RecyclableObject>(pvVar8);
    if ((((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
        .ptr != scriptContext) {
      pvVar8 = Js::CrossSite::MarshalVar(scriptContext,pRVar9,false);
    }
    lastLocation._56_8_ = Js::VarTo<Js::JavascriptFunction>(pvVar8);
    uVar5 = pJVar7->ArgCount;
    TVar11._0_2_ = (short)uVar5 - 1;
    TVar11._2_6_ = 0;
    for (uVar12 = 1; uVar12 < uVar5; uVar12 = uVar12 + 1) {
      pvVar8 = InflateVarInReplay(executeContext,pJVar7->ArgArray[uVar12]);
      if (pvVar8 == (Var)0x0) {
        return;
      }
      if (((ulong)pvVar8 >> 0x30 == 0) &&
         (pRVar9 = Js::VarTo<Js::RecyclableObject>(pvVar8),
         (((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
         scriptContext.ptr != scriptContext)) {
        pvVar8 = Js::CrossSite::MarshalVar(scriptContext,pRVar9,false);
      }
      pJVar7->AdditionalReplayInfo->ExecArgs[uVar12 - 1] = pvVar8;
      uVar5 = pJVar7->ArgCount;
    }
    ppvVar2 = pJVar7->AdditionalReplayInfo->ExecArgs;
    if (pJVar7->CallbackDepth == 0) {
      EventLog::ResetCallStackForTopLevelCall(pTVar1->TTDLog,pJVar7->TopLevelCallbackEventTime);
      this = pTVar1->TTDExecutionInfo;
      if (this != (ExecutionInfoManager *)0x0) {
        ExecutionInfoManager::ResetCallStackForTopLevelCall(this,pJVar7->TopLevelCallbackEventTime);
      }
      local_a0.Info = TVar11;
      local_a0.Values = ppvVar2;
      pvVar8 = Js::JavascriptFunction::CallRootFunction
                         ((JavascriptFunction *)lastLocation._56_8_,&local_a0,scriptContext,true);
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,pvVar8);
      bVar4 = EventCompletesNormally(evt);
      if (!bVar4) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
    else {
      local_b0.Info = TVar11;
      local_b0.Values = ppvVar2;
      pvVar8 = Js::JavascriptFunction::CallRootFunction
                         ((JavascriptFunction *)lastLocation._56_8_,&local_b0,scriptContext,true);
      if ((pvVar8 != (Var)0x0) &&
         (BVar6 = Js::CrossSite::NeedMarshalVar(pvVar8,scriptContext), BVar6 != 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                           ,0x475,
                           "(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx))",
                           "result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx)");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                (executeContext,evt,pvVar8);
      bVar4 = EventCompletesNormally(evt);
      if (!bVar4) {
        TTDAbort_unrecoverable_error("Why did we get a different completion");
      }
    }
  }
  return;
}

Assistant:

void JsRTCallFunctionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);

            const JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            ThreadContext* threadContext = ctx->GetThreadContext();

            Js::Var jsFunctionVar = InflateVarInReplay(executeContext, cfAction->ArgArray[0]);
            TTD_REPLAY_VALIDATE_INCOMING_FUNCTION(jsFunctionVar, ctx);

            Js::JavascriptFunction *jsFunction = Js::VarTo<Js::JavascriptFunction>(jsFunctionVar);

            //remove implicit constructor function as first arg in callInfo and argument loop below
            Js::CallInfo callInfo((ushort)(cfAction->ArgCount - 1));
            for(uint32 i = 1; i < cfAction->ArgCount; ++i)
            {
                 Js::Var argi = InflateVarInReplay(executeContext, cfAction->ArgArray[i]);
                 TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(argi, ctx);

                 cfAction->AdditionalReplayInfo->ExecArgs[i - 1] = argi;
            }
            Js::Arguments jsArgs(callInfo, cfAction->AdditionalReplayInfo->ExecArgs);

            //If this isn't a root function then just call it -- don't need to reset anything and exceptions can just continue
            if(cfAction->CallbackDepth != 0)
            {
                Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);
                if(result != nullptr)
                {
                    Assert(result == nullptr || !Js::CrossSite::NeedMarshalVar(result, ctx));
                }

                //since we tag in JsRT we need to tag here too
                JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
            }
            else
            {
                threadContext->TTDLog->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                if(threadContext->TTDExecutionInfo != nullptr)
                {
                    threadContext->TTDExecutionInfo->ResetCallStackForTopLevelCall(cfAction->TopLevelCallbackEventTime);
                }

                try
                {
                    Js::Var result = jsFunction->CallRootFunction(jsArgs, ctx, true);

                    //since we tag in JsRT we need to tag here too
                    JsRTActionHandleResultForReplay<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(executeContext, evt, result);

                    TTDAssert(NSLogEvents::EventCompletesNormally(evt), "Why did we get a different completion");
                }
                catch(const Js::JavascriptException& err)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        err.GetAndClear();  // discard exception object

                        //Reset any step controller logic
                        if(ctx->GetThreadContext()->GetDebugManager() != nullptr)
                        {
                            ctx->GetThreadContext()->GetDebugManager()->stepController.Deactivate();
                        }

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught JavaScript exception -- Propagate to top-level."));
                    }

                    throw;
                }
                catch(Js::ScriptAbortException)
                {
                    TTDAssert(NSLogEvents::EventCompletesWithException(evt), "Why did we get a different exception");

                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        //convert to uncaught debugger exception for host
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);

                        throw TTDebuggerAbortException::CreateUncaughtExceptionAbortRequest(lastLocation.GetRootEventTime(), _u("Uncaught Script exception -- Propagate to top-level."));
                    }
                    else
                    {
                        throw;
                    }
                }
                catch(...)
                {
                    if(executeContext->GetActiveScriptContext()->ShouldPerformReplayDebuggerAction())
                    {
                        TTDebuggerSourceLocation lastLocation;
                        threadContext->TTDExecutionInfo->GetLastExecutedTimeAndPositionForDebugger(lastLocation);
                        JsRTCallFunctionAction_SetLastExecutedStatementAndFrameInfo(const_cast<EventLogEntry*>(evt), lastLocation);
                    }

                    throw;
                }
            }
        }